

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_3::DBIter::FindNextUserEntry(DBIter *this,bool skipping,string *skip)

{
  Comparator *pCVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Slice local_50;
  undefined1 local_40 [8];
  ParsedInternalKey ikey;
  string *skip_local;
  bool skipping_local;
  DBIter *this_local;
  
  ikey._24_8_ = skip;
  uVar3 = (*this->iter_->_vptr_Iterator[2])();
  if ((uVar3 & 1) == 0) {
    __assert_fail("iter_->Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_iter.cc"
                  ,0xb3,
                  "void leveldb::(anonymous namespace)::DBIter::FindNextUserEntry(bool, std::string *)"
                 );
  }
  skip_local._7_1_ = skipping;
  if (this->direction_ == kForward) {
    do {
      ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_40);
      bVar2 = ParseKey(this,(ParsedInternalKey *)local_40);
      if ((bVar2) && (ikey.user_key.size_ <= this->sequence_)) {
        if ((int)ikey.sequence == 0) {
          SaveKey(this,(Slice *)local_40,(string *)ikey._24_8_);
          skip_local._7_1_ = 1;
        }
        else if ((int)ikey.sequence == 1) {
          bVar2 = false;
          if ((skip_local._7_1_ & 1) != 0) {
            pCVar1 = this->user_comparator_;
            Slice::Slice(&local_50,(string *)ikey._24_8_);
            iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,local_40,&local_50);
            bVar2 = iVar4 < 1;
          }
          if (!bVar2) {
            this->valid_ = true;
            std::__cxx11::string::clear();
            return;
          }
        }
      }
      (*this->iter_->_vptr_Iterator[6])();
      uVar3 = (*this->iter_->_vptr_Iterator[2])();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::clear();
        this->valid_ = false;
        return;
      }
    } while( true );
  }
  __assert_fail("direction_ == kForward",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_iter.cc"
                ,0xb4,
                "void leveldb::(anonymous namespace)::DBIter::FindNextUserEntry(bool, std::string *)"
               );
}

Assistant:

void DBIter::FindNextUserEntry(bool skipping, std::string* skip) {
  // Loop until we hit an acceptable entry to yield
  assert(iter_->Valid());
  assert(direction_ == kForward);
  do {
    ParsedInternalKey ikey;
    if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
      switch (ikey.type) {
        case kTypeDeletion:
          // Arrange to skip all upcoming entries for this key since
          // they are hidden by this deletion.
          SaveKey(ikey.user_key, skip);
          skipping = true;
          break;
        case kTypeValue:
          if (skipping &&
              user_comparator_->Compare(ikey.user_key, *skip) <= 0) {
            // Entry hidden
          } else {
            valid_ = true;
            saved_key_.clear();
            return;
          }
          break;
      }
    }
    iter_->Next();
  } while (iter_->Valid());
  saved_key_.clear();
  valid_ = false;
}